

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnAlgebraicCon
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int index,
          NumericExpr expr)

{
  MutAlgebraicCon MVar1;
  MutAlgebraicCon local_18;
  
  MVar1 = BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con(this->builder_,index);
  local_18.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       MVar1.
       super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_18.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       MVar1.
       super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_nonlinear_expr
            (&local_18,(NumericExpr)expr.super_ExprBase.impl_);
  return;
}

Assistant:

void OnAlgebraicCon(int index, NumericExpr expr) {
    builder_.algebraic_con(index).set_nonlinear_expr(expr);
  }